

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_serializer.cc
# Opt level: O2

void __thiscall
prometheus::TextSerializer::Serialize
          (TextSerializer *this,ostream *out,
          vector<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_> *metrics)

{
  pointer pBVar1;
  pointer pLVar2;
  pointer pQVar3;
  pointer pCVar4;
  pointer pMVar5;
  ostream *poVar6;
  char *pcVar7;
  ClientMetric *metric;
  pointer pCVar8;
  Quantile *q;
  pointer pBVar9;
  pointer pLVar10;
  pointer extraLabelValue;
  locale saved_locale;
  allocator local_da;
  allocator local_d9;
  pointer local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  allocator local_a9;
  pointer local_a8;
  locale local_a0 [8];
  string local_98;
  string local_78;
  undefined8 local_58;
  pointer local_50;
  pointer local_48;
  locale local_40 [8];
  locale local_38 [8];
  
  std::locale::locale(local_a0,(locale *)(out + *(long *)(*(long *)out + -0x18) + 0xd0));
  local_58 = *(undefined8 *)(out + *(long *)(*(long *)out + -0x18) + 8);
  std::locale::classic();
  std::ios::imbue(local_38);
  std::locale::~locale(local_38);
  *(undefined8 *)(out + *(long *)(*(long *)out + -0x18) + 8) = 0x10;
  local_50 = (metrics->
             super__Vector_base<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  pMVar5 = (metrics->
           super__Vector_base<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_>).
           _M_impl.super__Vector_impl_data._M_start;
  while (pMVar5 != local_50) {
    local_d8 = pMVar5;
    if ((pMVar5->help)._M_string_length != 0) {
      poVar6 = std::operator<<(out,"# HELP ");
      poVar6 = std::operator<<(poVar6,(string *)local_d8);
      poVar6 = std::operator<<(poVar6," ");
      poVar6 = std::operator<<(poVar6,(string *)&local_d8->help);
      std::operator<<(poVar6,"\n");
    }
    switch(local_d8->type) {
    case Counter:
      poVar6 = std::operator<<(out,"# TYPE ");
      poVar6 = std::operator<<(poVar6,(string *)local_d8);
      std::operator<<(poVar6," counter\n");
      pCVar4 = (local_d8->metric).
               super__Vector_base<prometheus::ClientMetric,_std::allocator<prometheus::ClientMetric>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (pCVar8 = (local_d8->metric).
                    super__Vector_base<prometheus::ClientMetric,_std::allocator<prometheus::ClientMetric>_>
                    ._M_impl.super__Vector_impl_data._M_start; pCVar8 != pCVar4; pCVar8 = pCVar8 + 1
          ) {
        std::__cxx11::string::string((string *)&local_78,"",&local_da);
        std::__cxx11::string::string((string *)&local_98,"",&local_d9);
        local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
        local_d0._M_string_length = 0;
        local_d0.field_2._M_local_buf[0] = '\0';
        (anonymous_namespace)::WriteHead<std::__cxx11::string>
                  (out,local_d8,pCVar8,&local_78,&local_98,&local_d0);
        std::__cxx11::string::~string((string *)&local_d0);
        std::__cxx11::string::~string((string *)&local_98);
        std::__cxx11::string::~string((string *)&local_78);
        anon_unknown_3::WriteValue(out,(pCVar8->counter).value);
        anon_unknown_3::WriteTail(out,pCVar8);
      }
      break;
    case Gauge:
      poVar6 = std::operator<<(out,"# TYPE ");
      poVar6 = std::operator<<(poVar6,(string *)local_d8);
      std::operator<<(poVar6," gauge\n");
      pCVar4 = (local_d8->metric).
               super__Vector_base<prometheus::ClientMetric,_std::allocator<prometheus::ClientMetric>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (pCVar8 = (local_d8->metric).
                    super__Vector_base<prometheus::ClientMetric,_std::allocator<prometheus::ClientMetric>_>
                    ._M_impl.super__Vector_impl_data._M_start; pCVar8 != pCVar4; pCVar8 = pCVar8 + 1
          ) {
        std::__cxx11::string::string((string *)&local_78,"",&local_da);
        std::__cxx11::string::string((string *)&local_98,"",&local_d9);
        local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
        local_d0._M_string_length = 0;
        local_d0.field_2._M_local_buf[0] = '\0';
        (anonymous_namespace)::WriteHead<std::__cxx11::string>
                  (out,local_d8,pCVar8,&local_78,&local_98,&local_d0);
        std::__cxx11::string::~string((string *)&local_d0);
        std::__cxx11::string::~string((string *)&local_98);
        std::__cxx11::string::~string((string *)&local_78);
        anon_unknown_3::WriteValue(out,(pCVar8->gauge).value);
        anon_unknown_3::WriteTail(out,pCVar8);
      }
      break;
    case Summary:
      poVar6 = std::operator<<(out,"# TYPE ");
      poVar6 = std::operator<<(poVar6,(string *)local_d8);
      std::operator<<(poVar6," summary\n");
      local_a8 = (local_d8->metric).
                 super__Vector_base<prometheus::ClientMetric,_std::allocator<prometheus::ClientMetric>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      for (pCVar8 = (local_d8->metric).
                    super__Vector_base<prometheus::ClientMetric,_std::allocator<prometheus::ClientMetric>_>
                    ._M_impl.super__Vector_impl_data._M_start; pCVar8 != local_a8;
          pCVar8 = pCVar8 + 1) {
        std::__cxx11::string::string((string *)&local_78,"_count",&local_da);
        std::__cxx11::string::string((string *)&local_98,"",&local_d9);
        local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
        local_d0._M_string_length = 0;
        local_d0.field_2._M_local_buf[0] = '\0';
        (anonymous_namespace)::WriteHead<std::__cxx11::string>
                  (out,local_d8,pCVar8,&local_78,&local_98,&local_d0);
        std::__cxx11::string::~string((string *)&local_d0);
        std::__cxx11::string::~string((string *)&local_98);
        std::__cxx11::string::~string((string *)&local_78);
        std::ostream::_M_insert<unsigned_long>((ulong)out);
        anon_unknown_3::WriteTail(out,pCVar8);
        std::__cxx11::string::string((string *)&local_78,"_sum",&local_da);
        std::__cxx11::string::string((string *)&local_98,"",&local_d9);
        local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
        local_d0._M_string_length = 0;
        local_d0.field_2._M_local_buf[0] = '\0';
        (anonymous_namespace)::WriteHead<std::__cxx11::string>
                  (out,local_d8,pCVar8,&local_78,&local_98,&local_d0);
        std::__cxx11::string::~string((string *)&local_d0);
        std::__cxx11::string::~string((string *)&local_98);
        std::__cxx11::string::~string((string *)&local_78);
        anon_unknown_3::WriteValue(out,(pCVar8->summary).sample_sum);
        anon_unknown_3::WriteTail(out,pCVar8);
        pQVar3 = (pCVar8->summary).quantile.
                 super__Vector_base<prometheus::ClientMetric::Quantile,_std::allocator<prometheus::ClientMetric::Quantile>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        for (extraLabelValue =
                  (pCVar8->summary).quantile.
                  super__Vector_base<prometheus::ClientMetric::Quantile,_std::allocator<prometheus::ClientMetric::Quantile>_>
                  ._M_impl.super__Vector_impl_data._M_start; extraLabelValue != pQVar3;
            extraLabelValue = extraLabelValue + 1) {
          std::__cxx11::string::string((string *)&local_78,"",(allocator *)&local_d0);
          std::__cxx11::string::string((string *)&local_98,"quantile",&local_da);
          anon_unknown_3::WriteHead<double>
                    (out,local_d8,pCVar8,&local_78,&local_98,&extraLabelValue->quantile);
          std::__cxx11::string::~string((string *)&local_98);
          std::__cxx11::string::~string((string *)&local_78);
          anon_unknown_3::WriteValue(out,extraLabelValue->value);
          anon_unknown_3::WriteTail(out,pCVar8);
        }
      }
      break;
    case Untyped:
      poVar6 = std::operator<<(out,"# TYPE ");
      poVar6 = std::operator<<(poVar6,(string *)local_d8);
      std::operator<<(poVar6," untyped\n");
      pCVar4 = (local_d8->metric).
               super__Vector_base<prometheus::ClientMetric,_std::allocator<prometheus::ClientMetric>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (pCVar8 = (local_d8->metric).
                    super__Vector_base<prometheus::ClientMetric,_std::allocator<prometheus::ClientMetric>_>
                    ._M_impl.super__Vector_impl_data._M_start; pCVar8 != pCVar4; pCVar8 = pCVar8 + 1
          ) {
        std::__cxx11::string::string((string *)&local_78,"",&local_da);
        std::__cxx11::string::string((string *)&local_98,"",&local_d9);
        local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
        local_d0._M_string_length = 0;
        local_d0.field_2._M_local_buf[0] = '\0';
        (anonymous_namespace)::WriteHead<std::__cxx11::string>
                  (out,local_d8,pCVar8,&local_78,&local_98,&local_d0);
        std::__cxx11::string::~string((string *)&local_d0);
        std::__cxx11::string::~string((string *)&local_98);
        std::__cxx11::string::~string((string *)&local_78);
        anon_unknown_3::WriteValue(out,(pCVar8->untyped).value);
        anon_unknown_3::WriteTail(out,pCVar8);
      }
      break;
    case Histogram:
      poVar6 = std::operator<<(out,"# TYPE ");
      poVar6 = std::operator<<(poVar6,(string *)local_d8);
      std::operator<<(poVar6," histogram\n");
      local_48 = (local_d8->metric).
                 super__Vector_base<prometheus::ClientMetric,_std::allocator<prometheus::ClientMetric>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      for (pCVar8 = (local_d8->metric).
                    super__Vector_base<prometheus::ClientMetric,_std::allocator<prometheus::ClientMetric>_>
                    ._M_impl.super__Vector_impl_data._M_start; pCVar8 != local_48;
          pCVar8 = pCVar8 + 1) {
        std::__cxx11::string::string((string *)&local_78,"_count",&local_da);
        std::__cxx11::string::string((string *)&local_98,"",&local_d9);
        local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
        local_d0._M_string_length = 0;
        local_d0.field_2._M_local_buf[0] = '\0';
        (anonymous_namespace)::WriteHead<std::__cxx11::string>
                  (out,local_d8,pCVar8,&local_78,&local_98,&local_d0);
        std::__cxx11::string::~string((string *)&local_d0);
        std::__cxx11::string::~string((string *)&local_98);
        std::__cxx11::string::~string((string *)&local_78);
        std::ostream::_M_insert<unsigned_long>((ulong)out);
        anon_unknown_3::WriteTail(out,pCVar8);
        std::__cxx11::string::string((string *)&local_78,"_sum",&local_da);
        std::__cxx11::string::string((string *)&local_98,"",&local_d9);
        local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
        local_d0._M_string_length = 0;
        local_d0.field_2._M_local_buf[0] = '\0';
        (anonymous_namespace)::WriteHead<std::__cxx11::string>
                  (out,local_d8,pCVar8,&local_78,&local_98,&local_d0);
        std::__cxx11::string::~string((string *)&local_d0);
        std::__cxx11::string::~string((string *)&local_98);
        std::__cxx11::string::~string((string *)&local_78);
        anon_unknown_3::WriteValue(out,(pCVar8->histogram).sample_sum);
        anon_unknown_3::WriteTail(out,pCVar8);
        pBVar9 = (pCVar8->histogram).bucket.
                 super__Vector_base<prometheus::ClientMetric::Bucket,_std::allocator<prometheus::ClientMetric::Bucket>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pBVar1 = (pCVar8->histogram).bucket.
                 super__Vector_base<prometheus::ClientMetric::Bucket,_std::allocator<prometheus::ClientMetric::Bucket>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        local_a8 = (pointer)0xfff0000000000000;
        for (; pBVar9 != pBVar1; pBVar9 = pBVar9 + 1) {
          std::__cxx11::string::string((string *)&local_78,"_bucket",(allocator *)&local_d0);
          std::__cxx11::string::string((string *)&local_98,"le",&local_da);
          anon_unknown_3::WriteHead<double>
                    (out,local_d8,pCVar8,&local_78,&local_98,&pBVar9->upper_bound);
          std::__cxx11::string::~string((string *)&local_98);
          std::__cxx11::string::~string((string *)&local_78);
          local_a8 = (pointer)pBVar9->upper_bound;
          std::ostream::_M_insert<unsigned_long>((ulong)out);
          anon_unknown_3::WriteTail(out,pCVar8);
        }
        if ((double)local_a8 < INFINITY) {
          std::__cxx11::string::string((string *)&local_98,"_bucket",&local_d9);
          std::__cxx11::string::string((string *)&local_d0,"le",&local_a9);
          poVar6 = std::operator<<(out,(string *)local_d8);
          std::operator<<(poVar6,(string *)&local_98);
          if (((pCVar8->label).
               super__Vector_base<prometheus::ClientMetric::Label,_std::allocator<prometheus::ClientMetric::Label>_>
               ._M_impl.super__Vector_impl_data._M_start !=
               (pCVar8->label).
               super__Vector_base<prometheus::ClientMetric::Label,_std::allocator<prometheus::ClientMetric::Label>_>
               ._M_impl.super__Vector_impl_data._M_finish) || (local_d0._M_string_length != 0)) {
            std::operator<<(out,"{");
            pLVar2 = (pCVar8->label).
                     super__Vector_base<prometheus::ClientMetric::Label,_std::allocator<prometheus::ClientMetric::Label>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            pcVar7 = "";
            for (pLVar10 = (pCVar8->label).
                           super__Vector_base<prometheus::ClientMetric::Label,_std::allocator<prometheus::ClientMetric::Label>_>
                           ._M_impl.super__Vector_impl_data._M_start; pLVar10 != pLVar2;
                pLVar10 = pLVar10 + 1) {
              poVar6 = std::operator<<(out,pcVar7);
              poVar6 = std::operator<<(poVar6,(string *)pLVar10);
              std::operator<<(poVar6,"=\"");
              anon_unknown_3::WriteValue(out,&pLVar10->value);
              std::operator<<(out,"\"");
              pcVar7 = ",";
            }
            if (local_d0._M_string_length != 0) {
              poVar6 = std::operator<<(out,pcVar7);
              poVar6 = std::operator<<(poVar6,(string *)&local_d0);
              std::operator<<(poVar6,"=\"");
              std::__cxx11::string::string((string *)&local_78,"+Inf",&local_da);
              anon_unknown_3::WriteValue(out,&local_78);
              std::__cxx11::string::~string((string *)&local_78);
              std::operator<<(out,"\"");
            }
            std::operator<<(out,"}");
          }
          std::operator<<(out," ");
          std::__cxx11::string::~string((string *)&local_d0);
          std::__cxx11::string::~string((string *)&local_98);
          std::ostream::_M_insert<unsigned_long>((ulong)out);
          anon_unknown_3::WriteTail(out,pCVar8);
        }
      }
      break;
    case Info:
      poVar6 = std::operator<<(out,"# TYPE ");
      poVar6 = std::operator<<(poVar6,(string *)local_d8);
      std::operator<<(poVar6," gauge\n");
      pCVar4 = (local_d8->metric).
               super__Vector_base<prometheus::ClientMetric,_std::allocator<prometheus::ClientMetric>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (pCVar8 = (local_d8->metric).
                    super__Vector_base<prometheus::ClientMetric,_std::allocator<prometheus::ClientMetric>_>
                    ._M_impl.super__Vector_impl_data._M_start; pCVar8 != pCVar4; pCVar8 = pCVar8 + 1
          ) {
        std::__cxx11::string::string((string *)&local_78,"_info",&local_da);
        std::__cxx11::string::string((string *)&local_98,"",&local_d9);
        local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
        local_d0._M_string_length = 0;
        local_d0.field_2._M_local_buf[0] = '\0';
        (anonymous_namespace)::WriteHead<std::__cxx11::string>
                  (out,local_d8,pCVar8,&local_78,&local_98,&local_d0);
        std::__cxx11::string::~string((string *)&local_d0);
        std::__cxx11::string::~string((string *)&local_98);
        std::__cxx11::string::~string((string *)&local_78);
        anon_unknown_3::WriteValue(out,(pCVar8->info).value);
        anon_unknown_3::WriteTail(out,pCVar8);
      }
    }
    pMVar5 = local_d8 + 1;
  }
  std::ios::imbue(local_40);
  std::locale::~locale(local_40);
  *(undefined8 *)(out + *(long *)(*(long *)out + -0x18) + 8) = local_58;
  std::locale::~locale(local_a0);
  return;
}

Assistant:

void TextSerializer::Serialize(std::ostream& out,
                               const std::vector<MetricFamily>& metrics) const {
  auto saved_locale = out.getloc();
  auto saved_precision = out.precision();

  out.imbue(std::locale::classic());
  out.precision(std::numeric_limits<double>::max_digits10 - 1);

  for (auto& family : metrics) {
    SerializeFamily(out, family);
  }

  out.imbue(saved_locale);
  out.precision(saved_precision);
}